

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  value_type vVar1;
  ulong uVar2;
  size_t sVar3;
  uint8_t uVar4;
  ulong uVar5;
  byte *pbVar6;
  pointer pvVar7;
  size_type sVar8;
  element_type *peVar9;
  ostream *poVar10;
  undefined8 uVar11;
  void *pvVar12;
  type_error *ptVar13;
  value_type *pvVar14;
  reference pvVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  char local_415;
  int local_414;
  stringstream local_410 [8];
  stringstream ss_1;
  ostream local_400 [383];
  undefined1 local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  char local_1dd;
  int local_1cc;
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [383];
  byte local_39;
  ulong uStack_38;
  uint8_t byte;
  size_t i;
  size_t bytes;
  uint local_20;
  uint8_t state;
  uint32_t codepoint;
  bool ensure_ascii_local;
  string_t *s_local;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  bytes._7_1_ = '\0';
  i = 0;
  uStack_38 = 0;
  state = ensure_ascii;
  _codepoint = s;
  s_local = (string_t *)this;
  do {
    uVar2 = uStack_38;
    uVar5 = std::__cxx11::string::size();
    if (uVar5 <= uVar2) {
      if (bytes._7_1_ == '\0') {
        if (i != 0) {
          peVar9 = Catch::clara::std::
                   __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          pvVar7 = Catch::clara::std::array<char,_512UL>::data(&this->string_buffer);
          (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,pvVar7,i);
        }
        return;
      }
      std::__cxx11::stringstream::stringstream(local_410);
      local_414 = (int)Catch::clara::std::setw(2);
      poVar10 = std::operator<<(local_400,(_Setw)local_414);
      uVar11 = std::ostream::operator<<(poVar10,Catch::clara::std::uppercase);
      local_415 = (char)Catch::clara::std::setfill<char>('0');
      poVar10 = std::operator<<(uVar11,local_415);
      pvVar12 = (void *)std::ostream::operator<<(poVar10,Catch::clara::std::hex);
      pbVar6 = (byte *)std::__cxx11::string::back();
      std::ostream::operator<<(pvVar12,(uint)*pbVar6);
      ptVar13 = (type_error *)__cxa_allocate_exception(0x20);
      std::__cxx11::stringstream::str();
      std::operator+(&local_438,"incomplete UTF-8 string; last byte: 0x",&local_458);
      type_error::create(ptVar13,0x13c,&local_438);
      __cxa_throw(ptVar13,&type_error::typeinfo,type_error::~type_error);
    }
    pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)_codepoint);
    local_39 = *pbVar6;
    uVar4 = decode((uint8_t *)((long)&bytes + 7),&local_20,local_39);
    sVar3 = i;
    if (uVar4 == '\0') {
      if (local_20 == 8) {
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        sVar3 = i;
        *pvVar15 = '\\';
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        *pvVar15 = 'b';
      }
      else if (local_20 == 9) {
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        sVar3 = i;
        *pvVar15 = '\\';
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        *pvVar15 = 't';
      }
      else if (local_20 == 10) {
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        sVar3 = i;
        *pvVar15 = '\\';
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        *pvVar15 = 'n';
      }
      else if (local_20 == 0xc) {
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        sVar3 = i;
        *pvVar15 = '\\';
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        *pvVar15 = 'f';
      }
      else if (local_20 == 0xd) {
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        sVar3 = i;
        *pvVar15 = '\\';
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        *pvVar15 = 'r';
      }
      else if (local_20 == 0x22) {
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        sVar3 = i;
        *pvVar15 = '\\';
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        *pvVar15 = '\"';
      }
      else if (local_20 == 0x5c) {
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        sVar3 = i;
        *pvVar15 = '\\';
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        *pvVar15 = '\\';
      }
      else if ((local_20 < 0x20) || (((state & 1) != 0 && (0x7e < local_20)))) {
        if (local_20 < 0x10000) {
          pvVar7 = Catch::clara::std::array<char,_512UL>::data(&this->string_buffer);
          snprintf(pvVar7 + i,7,"\\u%04x",(ulong)(local_20 & 0xffff));
          i = i + 6;
        }
        else {
          pvVar7 = Catch::clara::std::array<char,_512UL>::data(&this->string_buffer);
          snprintf(pvVar7 + i,0xd,"\\u%04x\\u%04x",(ulong)((local_20 >> 10) + 0xd7c0 & 0xffff),
                   (ulong)((local_20 & 0x3ff) + 0xdc00 & 0xffff));
          i = i + 0xc;
        }
      }
      else {
        pvVar14 = (value_type *)std::__cxx11::string::operator[]((ulong)_codepoint);
        sVar3 = i;
        vVar1 = *pvVar14;
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        *pvVar15 = vVar1;
      }
      sVar8 = Catch::clara::std::array<char,_512UL>::size(&this->string_buffer);
      if (sVar8 - i < 0xd) {
        peVar9 = Catch::clara::std::
                 __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        pvVar7 = Catch::clara::std::array<char,_512UL>::data(&this->string_buffer);
        (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,pvVar7,i);
        i = 0;
      }
    }
    else {
      if (uVar4 == '\x01') {
        std::__cxx11::stringstream::stringstream(local_1c8);
        local_1cc = (int)Catch::clara::std::setw(2);
        poVar10 = std::operator<<(local_1b8,(_Setw)local_1cc);
        uVar11 = std::ostream::operator<<(poVar10,Catch::clara::std::uppercase);
        local_1dd = (char)Catch::clara::std::setfill<char>('0');
        poVar10 = std::operator<<(uVar11,local_1dd);
        pvVar12 = (void *)std::ostream::operator<<(poVar10,Catch::clara::std::hex);
        std::ostream::operator<<(pvVar12,(uint)local_39);
        local_281 = 1;
        ptVar13 = (type_error *)__cxa_allocate_exception(0x20);
        Catch::clara::std::__cxx11::to_string(&local_260,uStack_38);
        std::operator+(&local_240,"invalid UTF-8 byte at index ",&local_260);
        std::operator+(&local_220,&local_240,": 0x");
        std::__cxx11::stringstream::str();
        std::operator+(&local_200,&local_220,&local_280);
        type_error::create(ptVar13,0x13c,&local_200);
        local_281 = 0;
        __cxa_throw(ptVar13,&type_error::typeinfo,type_error::~type_error);
      }
      if ((state & 1) == 0) {
        pvVar14 = (value_type *)std::__cxx11::string::operator[]((ulong)_codepoint);
        sVar3 = i;
        vVar1 = *pvVar14;
        i = i + 1;
        pvVar15 = Catch::clara::std::array<char,_512UL>::operator[](&this->string_buffer,sVar3);
        *pvVar15 = vVar1;
      }
    }
    uStack_38 = uStack_38 + 1;
  } while( true );
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii)
{
uint32_t codepoint;
uint8_t state = UTF8_ACCEPT;
std::size_t bytes = 0;  // number of bytes written to string_buffer

for (std::size_t i = 0; i < s.size(); ++i)
{
const auto byte = static_cast<uint8_t>(s[i]);

switch (decode(state, codepoint, byte))
{
case UTF8_ACCEPT:  // decode found a new code point
{
switch (codepoint)
{
case 0x08: // backspace
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = 'b';
break;
}

case 0x09: // horizontal tab
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = 't';
break;
}

case 0x0A: // newline
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = 'n';
break;
}

case 0x0C: // formfeed
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = 'f';
break;
}

case 0x0D: // carriage return
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = 'r';
break;
}

case 0x22: // quotation mark
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = '\"';
break;
}

case 0x5C: // reverse solidus
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = '\\';
break;
}

default:
{
// escape control characters (0x00..0x1F) or, if
// ensure_ascii parameter is used, non-ASCII characters
if ((codepoint <= 0x1F) or (ensure_ascii and (codepoint >= 0x7F)))
{
if (codepoint <= 0xFFFF)
{
std::snprintf(string_buffer.data() + bytes, 7, "\\u%04x",
static_cast<uint16_t>(codepoint));
bytes += 6;
}
else
{
std::snprintf(string_buffer.data() + bytes, 13, "\\u%04x\\u%04x",
static_cast<uint16_t>(0xD7C0 + (codepoint >> 10)),
static_cast<uint16_t>(0xDC00 + (codepoint & 0x3FF)));
bytes += 12;
}
}
else
{
// copy byte to buffer (all previous bytes
// been copied have in default case above)
string_buffer[bytes++] = s[i];
}
break;
}
}

// write buffer and reset index; there must be 13 bytes
// left, as this is the maximal number of bytes to be
// written ("\uxxxx\uxxxx\0") for one code point
if (string_buffer.size() - bytes < 13)
{
o->write_characters(string_buffer.data(), bytes);
bytes = 0;
}
break;
}

case UTF8_REJECT:  // decode found invalid UTF-8 byte
{
std::stringstream ss;
ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(byte);
JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + ss.str()));
}

default:  // decode found yet incomplete multi-byte code point
{
if (not ensure_ascii)
{
// code point will not be escaped - copy byte to buffer
string_buffer[bytes++] = s[i];
}
break;
}
}
}

if (JSON_LIKELY(state == UTF8_ACCEPT))
{
// write buffer
if (bytes > 0)
{
o->write_characters(string_buffer.data(), bytes);
}
}
else
{
// we finish reading, but do not accept: string was incomplete
std::stringstream ss;
ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(static_cast<uint8_t>(s.back()));
JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + ss.str()));
}
}